

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O3

void GLPortal::StartFrame(void)

{
  TArray<GLPortal_*,_GLPortal_*>::Grow(&portals,1);
  portals.Array[portals.Count] = (GLPortal *)0x0;
  portals.Count = portals.Count + 1;
  if (renderdepth == 0) {
    inskybox = false;
    instack[0] = 0;
    instack[1] = 0;
  }
  renderdepth = renderdepth + 1;
  return;
}

Assistant:

void GLPortal::StartFrame()
{
	GLPortal * p=NULL;
	portals.Push(p);
	if (renderdepth==0)
	{
		inskybox=false;
		instack[sector_t::floor]=instack[sector_t::ceiling]=0;
	}
	renderdepth++;
}